

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  TPZVec<double> *in_RCX;
  uint in_EDI;
  TPZVec<long> *in_R8;
  TPZVec<int> *in_R9;
  TPZFMatrix<double> *in_stack_00000a60;
  TPZFMatrix<double> *in_stack_00000a68;
  TPZVec<int> *in_stack_00000a70;
  TPZVec<long> *in_stack_00000a78;
  TPZVec<double> *in_stack_00000a80;
  TPZFMatrix<double> *in_stack_00000f50;
  TPZFMatrix<double> *in_stack_00000f58;
  TPZVec<int> *in_stack_00000f60;
  TPZVec<long> *in_stack_00000f68;
  TPZVec<double> *in_stack_00000f70;
  undefined4 in_stack_ffffffffffffffc8;
  
  if (in_EDI < 4) {
    TPZShapePoint::Shape
              (in_RCX,in_R8,in_R9,(TPZFMatrix<double> *)CONCAT44(in_EDI,in_stack_ffffffffffffffc8),
               (TPZFMatrix<double> *)0x1890227);
  }
  else if (in_EDI - 4 < 4) {
    TPZShapeLinear::Shape
              (in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
               in_stack_00000a60);
  }
  else if (in_EDI == 8) {
    Shape(in_stack_00000f70,in_stack_00000f68,in_stack_00000f60,in_stack_00000f58,in_stack_00000f50)
    ;
  }
  return;
}

Assistant:

void TPZShapeQuad::SideShape(int side,TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
								 TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		switch(side) {
			case 0:
			case 1:
			case 2:
			case 3:
				TPZShapePoint::Shape(pt, id, order, phi, dphi);
				break;
			case 4:
			case 5:
			case 6:
			case 7:
				TPZShapeLinear::Shape(pt, id, order, phi, dphi);
				break;
			case 8:
				Shape(pt, id, order, phi, dphi);
		}
	}